

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O1

int __thiscall geemuboi::core::CPU::add_hl_de(CPU *this)

{
  Registers *pRVar1;
  byte bVar2;
  byte bVar3;
  
  pRVar1 = this->regs;
  bVar2 = pRVar1->d;
  bVar3 = pRVar1->f & 0x80;
  pRVar1->f = bVar3;
  if ((0xff < (uint)pRVar1->l + (uint)pRVar1->e) && (bVar2 = bVar2 + 1, bVar2 == 0)) {
    pRVar1->f = bVar3 | 0x30;
    bVar2 = 0;
  }
  pRVar1->l = pRVar1->e + pRVar1->l;
  bVar3 = pRVar1->h;
  if (0xf < (bVar2 & 0xf) + (bVar3 & 0xf)) {
    pRVar1->f = pRVar1->f | 0x20;
  }
  if (0xff < (uint)bVar2 + (uint)bVar3) {
    pRVar1->f = pRVar1->f | 0x10;
  }
  pRVar1->h = bVar3 + bVar2;
  return 2;
}

Assistant:

int CPU::add_hl_de() {
    add_hl_r16(regs.d, regs.e);
    return 2;
}